

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O1

Tim_Man_t * Tim_ManStart(int nCis,int nCos)

{
  Tim_Man_t *pTVar1;
  Mem_Flex_t *pMVar2;
  Tim_Obj_t *__s;
  Tim_Obj_t *__s_00;
  float *pfVar3;
  ulong uVar4;
  
  pTVar1 = (Tim_Man_t *)malloc(0x38);
  pTVar1->vBoxes = (Vec_Ptr_t *)0x0;
  pTVar1->vDelayTables = (Vec_Ptr_t *)0x0;
  pTVar1->pMemObj = (Mem_Flex_t *)0x0;
  pTVar1->nTravIds = 0;
  pTVar1->fUseTravId = 0;
  pTVar1->nCis = 0;
  pTVar1->nCos = 0;
  pTVar1->pCis = (Tim_Obj_t *)0x0;
  pTVar1->pCos = (Tim_Obj_t *)0x0;
  pMVar2 = Mem_FlexStart();
  pTVar1->pMemObj = pMVar2;
  pTVar1->nCis = nCis;
  pTVar1->nCos = nCos;
  __s = (Tim_Obj_t *)malloc((long)nCis * 0x18);
  pTVar1->pCis = __s;
  memset(__s,0,(long)nCis * 0x18);
  __s_00 = (Tim_Obj_t *)malloc((long)nCos * 0x18);
  pTVar1->pCos = __s_00;
  memset(__s_00,0,(long)nCos * 0x18);
  if (0 < nCis && __s != (Tim_Obj_t *)0x0) {
    pfVar3 = &__s->timeReq;
    uVar4 = 0;
    do {
      ((Tim_Obj_t *)(pfVar3 + -5))->Id = (int)uVar4;
      *(undefined8 *)(pfVar3 + -3) = 0xffffffffffffffff;
      *pfVar3 = 1e+09;
      if (__s == (Tim_Obj_t *)0x0) break;
      uVar4 = uVar4 + 1;
      pfVar3 = pfVar3 + 6;
    } while (uVar4 < (uint)nCis);
  }
  if (0 < nCos && __s_00 != (Tim_Obj_t *)0x0) {
    pfVar3 = &__s_00->timeReq;
    uVar4 = 0;
    do {
      ((Tim_Obj_t *)(pfVar3 + -5))->Id = (int)uVar4;
      *(undefined8 *)(pfVar3 + -3) = 0xffffffffffffffff;
      *pfVar3 = 1e+09;
      if (__s_00 == (Tim_Obj_t *)0x0) break;
      uVar4 = uVar4 + 1;
      pfVar3 = pfVar3 + 6;
    } while (uVar4 < (uint)nCos);
  }
  pTVar1->fUseTravId = 1;
  return pTVar1;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Starts the timing manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Tim_Man_t * Tim_ManStart( int nCis, int nCos )
{
    Tim_Man_t * p;
    Tim_Obj_t * pObj;
    int i;
    p = ABC_ALLOC( Tim_Man_t, 1 );
    memset( p, 0, sizeof(Tim_Man_t) );
    p->pMemObj = Mem_FlexStart();
    p->nCis = nCis;
    p->nCos = nCos;
    p->pCis = ABC_ALLOC( Tim_Obj_t, nCis );
    memset( p->pCis, 0, sizeof(Tim_Obj_t) * nCis );
    p->pCos = ABC_ALLOC( Tim_Obj_t, nCos );
    memset( p->pCos, 0, sizeof(Tim_Obj_t) * nCos );
    Tim_ManForEachCi( p, pObj, i )
    {
        pObj->Id = i;
        pObj->iObj2Box = pObj->iObj2Num = -1;
        pObj->timeReq = TIM_ETERNITY;
    }
    Tim_ManForEachCo( p, pObj, i )
    {
        pObj->Id = i;
        pObj->iObj2Box = pObj->iObj2Num = -1;
        pObj->timeReq = TIM_ETERNITY;
    }
    p->fUseTravId = 1;
    return p;
}